

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

Pair * __thiscall camp::Enum::pair(Enum *this,size_t index)

{
  size_type sVar1;
  OutOfRange *__return_storage_ptr__;
  size_type size;
  const_reference pvVar2;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [48];
  OutOfRange local_60;
  size_type local_18;
  size_t index_local;
  Enum *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  sVar1 = boost::multi_index::detail::
          random_access_index<boost::multi_index::detail::nth_layer<1,_camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>,_boost::mpl::v_item<camp::Enum::Id,_boost::mpl::vector0<mpl_::na>,_0>_>
          ::size(&(this->m_pairs).super_type);
  if (sVar1 <= index) {
    __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
    sVar1 = local_18;
    size = boost::multi_index::detail::
           random_access_index<boost::multi_index::detail::nth_layer<1,_camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>,_boost::mpl::v_item<camp::Enum::Id,_boost::mpl::vector0<mpl_::na>,_0>_>
           ::size(&(this->m_pairs).super_type);
    OutOfRange::OutOfRange(&local_60,sVar1,size);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enum.cpp"
               ,&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"const Enum::Pair &camp::Enum::pair(std::size_t) const",&local_b9);
    Error::prepare<camp::OutOfRange>
              (__return_storage_ptr__,&local_60,(string *)local_90,0x38,(string *)local_b8);
    __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,OutOfRange::~OutOfRange);
  }
  pvVar2 = boost::multi_index::detail::
           random_access_index<boost::multi_index::detail::nth_layer<1,_camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>,_boost::mpl::v_item<camp::Enum::Id,_boost::mpl::vector0<mpl_::na>,_0>_>
           ::operator[](&(this->m_pairs).super_type,local_18);
  return pvVar2;
}

Assistant:

const Enum::Pair& Enum::pair(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_pairs.size())
        CAMP_ERROR(OutOfRange(index, m_pairs.size()));

    return m_pairs[index];
}